

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O3

error eval_expr(atom expr,atom env,atom *result)

{
  char **ppcVar1;
  uint uVar2;
  anon_union_8_9_1d3277aa_for_value aVar3;
  long lVar4;
  uint *puVar5;
  char *pcVar6;
  error eVar7;
  type *ptVar8;
  int iVar9;
  anon_union_8_9_1d3277aa_for_value aVar10;
  type tVar11;
  anon_union_8_9_1d3277aa_for_value aVar12;
  type tVar13;
  undefined4 saved_size;
  char **ppcVar14;
  atom a;
  atom expr_00;
  atom expr_01;
  atom car_val;
  atom env_00;
  atom expr_02;
  atom expr_03;
  atom fn_00;
  atom env_01;
  atom expr_04;
  atom env_02;
  atom env_03;
  atom env_04;
  atom env_05;
  atom env_06;
  atom cdr_val;
  atom arg_names;
  atom env_07;
  atom env_08;
  atom env_09;
  atom args_00;
  atom args_01;
  atom v;
  atom item;
  atom a_00;
  atom a_01;
  atom a_02;
  atom aVar15;
  atom body;
  atom body_00;
  atom value;
  atom args;
  atom fn;
  atom r;
  vector vargs;
  error local_118;
  type local_114;
  char *local_108;
  type *ptStack_100;
  anon_union_8_9_1d3277aa_for_value local_f0;
  atom local_e8;
  atom local_d8;
  undefined1 local_c8 [8];
  atom aaStack_c0 [8];
  size_t local_40;
  size_t local_38;
  
  aVar10 = env.value;
  aVar12 = expr.value;
  tVar11 = env.type;
  tVar13 = expr.type;
  saved_size = (int)stack_size;
  do {
    aVar15._4_4_ = 0;
    aVar15.type = tVar13;
    aVar15.value.number = aVar12.number;
    stack_add(aVar15);
    a._0_8_ = CONCAT44(0,tVar11);
    a.value.number = aVar10.number;
    stack_add(a);
    if (alloc_count_old * 2 < alloc_count) {
      gc();
    }
    if (tVar13 != T_CONS) {
      if (tVar13 == T_SYM) {
        env_01.value.number = aVar10.number;
        env_01._0_8_ = a._0_8_;
        eVar7 = env_get(env_01,aVar12.symbol,result);
        err_expr.type = T_SYM;
        err_expr._4_4_ = local_114;
        err_expr.value = aVar12;
        return eVar7;
      }
      result->type = tVar13;
      *(type *)&result->field_0x4 = local_114;
      (result->value).fp = (FILE *)aVar12;
      return ERROR_OK;
    }
    tVar13 = ((aVar12.pair)->car).type;
    a._0_8_ = (ulong)tVar13;
    aVar3 = (anon_union_8_9_1d3277aa_for_value)(aVar12.fp)->_IO_read_ptr;
    local_108 = (char *)(*aVar12.jb)[0].__jmpbuf[2];
    ptStack_100 = (type *)(aVar12.fp)->_IO_read_base;
    if (tVar13 == T_SYM) {
      if (sym_if.value.pair != aVar3.pair) {
        if (sym_assign.value.pair == aVar3.pair) {
          if (((int)local_108 == 0) || (ptStack_100[4] == T_NIL)) goto LAB_00105972;
          if (*ptStack_100 != T_SYM) {
LAB_00105999:
            stack_restore(saved_size);
            return ERROR_TYPE;
          }
          pcVar6 = *(char **)(ptStack_100 + 2);
          expr_04._0_8_ = CONCAT44(0,**(uint **)(ptStack_100 + 6));
          env_09._4_4_ = 0;
          env_09.type = tVar11;
          expr_04.value.pair =
               ((anon_union_8_9_1d3277aa_for_value *)(*(uint **)(ptStack_100 + 6) + 2))->pair;
          env_09.value.number = aVar10.number;
          eVar7 = eval_expr(expr_04,env_09,(atom *)local_c8);
          if (eVar7 != ERROR_OK) {
LAB_0010596b:
            stack_restore(saved_size);
            return eVar7;
          }
          *(undefined1 (*) [8])result = local_c8;
          (result->value).pair = (pair *)aaStack_c0[0]._0_8_;
          value._0_8_ = (ulong)local_c8 & 0xffffffff;
          env_04.value.number = aVar10.number;
          env_04._0_8_ = expr_04._0_8_;
          value.value.pair = (pair *)aaStack_c0[0]._0_8_;
          env_assign_eq(env_04,pcVar6,value);
          tVar13 = result->type;
          aVar12 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
          eVar7 = ERROR_OK;
        }
        else {
          if (sym_quote.value.pair == aVar3.pair) {
            if (((int)local_108 != 0) && (ptStack_100[4] == T_NIL)) {
              tVar13 = ptStack_100[1];
              aVar12 = *(anon_union_8_9_1d3277aa_for_value *)(ptStack_100 + 2);
              result->type = ptStack_100[0];
              *(type *)&result->field_0x4 = tVar13;
              result->value = aVar12;
              tVar13 = result->type;
              aVar12 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
LAB_001058c8:
              a_02._4_4_ = 0;
              a_02.type = tVar13;
              a_02.value.number = aVar12.number;
              stack_restore_add(saved_size,a_02);
              return ERROR_OK;
            }
LAB_00105972:
            stack_restore(saved_size);
            return ERROR_ARGS;
          }
          if (sym_fn.value.pair != aVar3.pair) {
            if (sym_do.value.pair != aVar3.pair) {
              if (sym_mac.value.pair == aVar3.pair) {
                if (((int)local_108 != 0) && (ptStack_100[4] != T_NIL)) {
                  puVar5 = *(uint **)(ptStack_100 + 6);
                  body_00._4_4_ = 0;
                  body_00.type = puVar5[4];
                  if (puVar5[4] != 0) {
                    if (*ptStack_100 != T_SYM) goto LAB_00105999;
                    tVar13 = ptStack_100[1];
                    pcVar6 = *(char **)(ptStack_100 + 2);
                    args_01._4_4_ = 0;
                    args_01.type = *puVar5;
                    env_03._4_4_ = 0;
                    env_03.type = tVar11;
                    env_03.value.number = aVar10.number;
                    args_01.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar5 + 2))->pair;
                    body_00.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar5 + 6))->pair;
                    eVar7 = make_closure(env_03,args_01,body_00,(atom *)local_c8);
                    if (eVar7 != ERROR_OK) goto LAB_0010596b;
                    result->type = T_SYM;
                    *(type *)&result->field_0x4 = tVar13;
                    (result->value).symbol = pcVar6;
                    v.value.pair = (pair *)aaStack_c0[0]._0_8_;
                    v._0_8_ = 6;
                    table_set_sym((table *)(aVar10.fp)->_IO_read_base,pcVar6,v);
                    tVar13 = result->type;
                    aVar12 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
                    goto LAB_001058c8;
                  }
                }
                goto LAB_00105972;
              }
              a._0_8_ = 2;
              goto LAB_001054ed;
            }
            if ((int)local_108 == 0) {
              return ERROR_OK;
            }
            while (ptVar8 = ptStack_100, tVar13 = *ptStack_100, ptStack_100[4] != T_NIL) {
              expr_03._4_4_ = 0;
              expr_03.type = tVar13;
              env_08._4_4_ = 0;
              env_08.type = tVar11;
              expr_03.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptStack_100 + 2))->pair;
              env_08.value.number = aVar10.number;
              eVar7 = eval_expr(expr_03,env_08,result);
              if (eVar7 != ERROR_OK) {
                return eVar7;
              }
              local_108 = *(char **)(ptVar8 + 4);
              ptStack_100 = *(type **)(ptVar8 + 6);
              if ((int)local_108 == 0) {
                return ERROR_OK;
              }
            }
            local_114 = ptStack_100[1];
            aVar12 = (anon_union_8_9_1d3277aa_for_value)
                     ((anon_union_8_9_1d3277aa_for_value *)(ptStack_100 + 2))->fp;
            goto LAB_001057b9;
          }
          if ((int)local_108 == 0) goto LAB_00105972;
          args_00._4_4_ = 0;
          args_00.type = *ptStack_100;
          body._4_4_ = 0;
          body.type = ptStack_100[4];
          env_02._4_4_ = 0;
          env_02.type = tVar11;
          env_02.value.number = aVar10.number;
          args_00.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptStack_100 + 2))->pair;
          body.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptStack_100 + 6))->pair;
          eVar7 = make_closure(env_02,args_00,body,result);
          tVar13 = result->type;
          aVar12 = (anon_union_8_9_1d3277aa_for_value)(result->value).pair;
        }
        a._0_8_ = (ulong)tVar13;
LAB_00105817:
        a_01.value.number = aVar12.number;
        a_01._0_8_ = a._0_8_;
        stack_restore_add(saved_size,a_01);
        return eVar7;
      }
      local_f0._0_4_ = saved_size;
      if ((int)local_108 == 0) {
LAB_00105802:
        *(undefined8 *)result = 0;
        (result->value).number = 0.0;
        eVar7 = ERROR_OK;
        a._0_8_ = 0;
        aVar12.number = 0.0;
        saved_size = local_f0._0_4_;
        goto LAB_00105817;
      }
      ppcVar14 = &local_108;
      while( true ) {
        ptVar8 = (type *)ppcVar14[1];
        tVar13 = *ptVar8;
        if (ptVar8[4] == T_NIL) break;
        expr_02._4_4_ = 0;
        expr_02.type = tVar13;
        env_07._4_4_ = 0;
        env_07.type = tVar11;
        expr_02.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(ptVar8 + 2))->pair;
        env_07.value.number = aVar10.number;
        eVar7 = eval_expr(expr_02,env_07,(atom *)local_c8);
        if (eVar7 != ERROR_OK) {
          saved_size = local_f0._0_4_;
          goto LAB_00105503;
        }
        ptVar8 = *(type **)(ppcVar14[1] + 0x18);
        if (local_c8._0_4_ != T_NIL) {
          tVar13 = *ptVar8;
          break;
        }
        ppcVar14 = (char **)(ptVar8 + 4);
        if (ptVar8[4] == T_NIL) goto LAB_00105802;
      }
      local_114 = ptVar8[1];
      aVar12 = (anon_union_8_9_1d3277aa_for_value)
               ((anon_union_8_9_1d3277aa_for_value *)(ptVar8 + 2))->fp;
      iVar9 = 2;
      saved_size = local_f0._0_4_;
    }
    else {
LAB_001054ed:
      env_05._4_4_ = 0;
      env_05.type = tVar11;
      expr_00.value.pair = aVar3.pair;
      expr_00._0_8_ = a._0_8_;
      env_05.value.number = aVar10.number;
      eVar7 = eval_expr(expr_00,env_05,&local_e8);
      if (eVar7 == ERROR_OK) {
        local_40 = 8;
        local_38 = 0;
        local_c8 = (undefined1  [8])aaStack_c0;
        if ((int)local_108 != 0) {
          ppcVar14 = &local_108;
          do {
            expr_01._4_4_ = 0;
            expr_01.type = *(uint *)ppcVar14[1];
            env_06._4_4_ = 0;
            env_06.type = tVar11;
            expr_01.value.pair =
                 ((anon_union_8_9_1d3277aa_for_value *)((long)ppcVar14[1] + 8))->pair;
            env_06.value.number = aVar10.number;
            eVar7 = eval_expr(expr_01,env_06,&local_d8);
            if (eVar7 != ERROR_OK) {
              if (local_c8 != (undefined1  [8])aaStack_c0) {
                free((void *)local_c8);
              }
              goto LAB_00105503;
            }
            item._4_4_ = 0;
            item.type = local_d8.type;
            item.value.number = local_d8.value.number;
            vector_add((vector *)local_c8,item);
            ppcVar1 = ppcVar14 + 1;
            ppcVar14 = (char **)(*ppcVar1 + 0x10);
          } while (*(int *)(*ppcVar1 + 0x10) != 0);
        }
        fn_00._4_4_ = 0;
        fn_00.type = local_e8.type;
        if (local_e8.type == T_CLOSURE) {
          uVar2 = *(uint *)(local_e8.value.fp)->_IO_read_base;
          local_f0 = (anon_union_8_9_1d3277aa_for_value)
                     ((anon_union_8_9_1d3277aa_for_value *)
                     ((long)(local_e8.value.fp)->_IO_read_base + 8))->pair;
          tVar13 = ((local_e8.value.pair)->car).type;
          aVar12 = (anon_union_8_9_1d3277aa_for_value)(local_e8.value.fp)->_IO_read_ptr;
          aVar15 = make_table(4);
          car_val._4_4_ = 0;
          car_val.type = tVar13;
          car_val.value =
               (anon_union_8_9_1d3277aa_for_value)(anon_union_8_9_1d3277aa_for_value)aVar12.pair;
          cdr_val.value.number = aVar15.value.number;
          cdr_val._0_8_ = 0xb;
          aVar15 = cons(car_val,cdr_val);
          aVar10 = aVar15.value;
          lVar4 = (*local_e8.value.jb)[0].__jmpbuf[3];
          tVar13 = *(type *)(lVar4 + 0x10);
          local_114 = *(type *)(lVar4 + 0x14);
          aVar12 = (anon_union_8_9_1d3277aa_for_value)
                   ((anon_union_8_9_1d3277aa_for_value *)(lVar4 + 0x18))->fp;
          tVar11 = T_CONS;
          arg_names._4_4_ = 0;
          arg_names.type = uVar2;
          env_00.value.number = aVar10.number;
          env_00._0_8_ = 1;
          arg_names.value.number = local_f0.number;
          eVar7 = env_bind(env_00,arg_names,(vector *)local_c8);
          if (eVar7 == ERROR_OK) {
            if (local_c8 != (undefined1  [8])aaStack_c0) {
              free((void *)local_c8);
            }
LAB_001057b9:
            stack_restore(saved_size);
            iVar9 = 2;
          }
          else {
            iVar9 = 1;
            local_118 = eVar7;
          }
        }
        else {
          fn_00.value.number = local_e8.value.number;
          local_118 = apply(fn_00,(vector *)local_c8,result);
          if (local_c8 != (undefined1  [8])aaStack_c0) {
            free((void *)local_c8);
          }
          a_00._4_4_ = 0;
          a_00.type = result->type;
          a_00.value.pair = (result->value).pair;
          stack_restore_add(saved_size,a_00);
          iVar9 = 1;
          tVar13 = T_CONS;
        }
      }
      else {
LAB_00105503:
        stack_restore(saved_size);
        iVar9 = 1;
        tVar13 = T_CONS;
        local_118 = eVar7;
      }
    }
    if (iVar9 != 2) {
      return local_118;
    }
  } while( true );
}

Assistant:

error eval_expr(atom expr, atom env, atom *result)
{
	error err;
	int ss = stack_size; /* save stack point */
start_eval:
	stack_add(expr);
	stack_add(env);
	consider_gc();
	if (expr.type == T_SYM) {
		err = env_get(env, expr.value.symbol, result);
		err_expr = expr;
		return err;
	}
	else if (expr.type != T_CONS) {
		*result = expr;
		return ERROR_OK;
	}
	else {
		atom op = car(expr);
		atom args = cdr(expr);

		if (op.type == T_SYM) {
			/* Handle special forms */
			if (op.value.symbol == sym_if.value.symbol) {
				atom *p = &args;
				while (!no(*p)) {
					atom cond;
					if (no(cdr(*p))) { /* else */
						/* tail call optimization of else part */
						expr = car(*p);
						goto start_eval;
					}
					err = eval_expr(car(*p), env, &cond);
					if (err) {
						stack_restore(ss);
						return err;
					}
					if (!no(cond)) { /* then */
						/* tail call optimization of err = eval_expr(car(cdr(*p)), env, result); */
						expr = car(cdr(*p));
						goto start_eval;
					}
					p = &cdr(cdr(*p));
				}
				*result = nil;
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_assign.value.symbol) {
				atom sym;
				if (no(args) || no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				sym = car(args);
				if (sym.type == T_SYM) {
					atom val;
					err = eval_expr(car(cdr(args)), env, &val);
					if (err) {
						stack_restore(ss);
						return err;
					}

					*result = val;
					err = env_assign_eq(env, sym.value.symbol, val);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return ERROR_TYPE;
				}
			}
			else if (op.value.symbol == sym_quote.value.symbol) {
				if (no(args) || !no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				*result = car(args);
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_fn.value.symbol) {
				if (no(args)) {
					stack_restore(ss);
					return ERROR_ARGS;
				}
				err = make_closure(env, car(args), cdr(args), result);
				stack_restore_add(ss, *result);
				return err;
			}
			else if (op.value.symbol == sym_do.value.symbol) {
				/* Evaluate the body */
				while (!no(args)) {
					if (no(cdr(args))) {
						/* tail call */
						expr = car(args);
						stack_restore(ss);
						goto start_eval;
					}
					error err = eval_expr(car(args), env, result);
					if (err) {
						return err;
					}
					args = cdr(args);
				}
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_mac.value.symbol) { /* (mac name (arg ...) body) */
				atom name, macro;

				if (no(args) || no(cdr(args)) || no(cdr(cdr(args)))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				name = car(args);
				if (name.type != T_SYM) {
					stack_restore(ss);
					return ERROR_TYPE;
				}

				err = make_closure(env, car(cdr(args)), cdr(cdr(args)), &macro);
				if (!err) {
					macro.type = T_MACRO;
					*result = name;
					err = env_assign(env, name.value.symbol, macro);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return err;
				}
			}
		}

		/* Evaluate operator */
		atom fn;
		err = eval_expr(op, env, &fn);
		if (err) {
			stack_restore(ss);
			return err;
		}

		/* Evaulate arguments */
		struct vector vargs;
		vector_new(&vargs);
		atom *p = &args;
		while (!no(*p)) {
			atom r;
			err = eval_expr(car(*p), env, &r);
			if (err) {
				vector_free(&vargs);
				stack_restore(ss);
				return err;
			}
			vector_add(&vargs, r);
			p = &cdr(*p);
		}

		/* tail call optimization of err = apply(fn, args, result); */
		if (fn.type == T_CLOSURE) {
			atom arg_names = car(cdr(fn));
			env = env_create(car(fn));
			expr = cdr(cdr(fn));

			/* Bind the arguments */
			err = env_bind(env, arg_names, &vargs);
			if (err) {
				return err;
			}
			vector_free(&vargs);
			stack_restore(ss);
			goto start_eval;
		}
		else {
			err = apply(fn, &vargs, result);
			vector_free(&vargs);
		}
		stack_restore_add(ss, *result);
		return err;
	}
}